

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost12sum.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  FILE *f;
  char *pcVar6;
  char *pcVar7;
  int hashsize;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  int expected_hash_size;
  char sum_2 [129];
  char calcsum [129];
  gost2012_hash_ctx ctx;
  char sum [129];
  int local_1288;
  uint local_1284;
  undefined8 local_1280;
  ulong local_1278;
  char *local_1270;
  char local_1268 [144];
  char local_11d8 [144];
  gost2012_hash_ctx local_1148;
  char local_1038 [4104];
  
  local_1280 = 0;
  bVar2 = true;
  bVar1 = false;
  iVar4 = 0x20;
  f = (FILE *)0x0;
  do {
    while( true ) {
      do {
        hashsize = iVar4;
        iVar3 = getopt(argc,argv,"hxlvc::");
        iVar4 = 0x40;
      } while (iVar3 == 0x6c);
      if (iVar3 < 0x76) break;
      if (iVar3 == 0x76) {
        local_1280 = 1;
        bVar2 = false;
        iVar4 = hashsize;
      }
      else {
        if (iVar3 != 0x78) {
LAB_00101410:
          fprintf(_stderr,"invalid option %c\n",(ulong)_optopt);
          help();
LAB_00101436:
          local_1288 = 0;
          if (((f != _stdin) || (argc <= _optind)) ||
             (f = fopen(argv[_optind],"r"), f != (FILE *)0x0)) {
            iVar4 = get_line((FILE *)f,local_1268,local_1038,(int)local_1280,&local_1288);
            if (iVar4 == 0) {
              uVar10 = 0;
              uVar13 = 0;
            }
            else {
              local_1270 = "%s\tFAILED\n";
              if (bVar2) {
                local_1270 = "%s: GOST hash sum check failed\n";
              }
              uVar8 = 0;
              local_1284 = 0;
              uVar11 = 0;
              do {
                lVar9 = (long)local_1288;
                uVar12 = (ulong)((int)uVar11 + 1);
                local_1278 = uVar11;
                if (lVar9 == 0) {
                  fprintf(_stderr,"%s: invalid hash length\n",local_1038);
                }
                else {
                  iVar4 = hash_file(&local_1148,local_1038,local_11d8,0,local_1288);
                  if (iVar4 != 0) {
                    iVar4 = strncmp(local_11d8,local_1268,lVar9 * 2 + 1);
                    uVar12 = local_1278;
                    if (iVar4 == 0) {
                      if (!bVar2) {
                        fprintf(_stderr,"%s\tOK\n",local_1038);
                      }
                    }
                    else {
                      fprintf(_stderr,local_1270,local_1038);
                      local_1284 = local_1284 + 1;
                      uVar12 = local_1278;
                    }
                  }
                }
                uVar8 = uVar8 + 1;
                iVar4 = get_line((FILE *)f,local_1268,local_1038,(int)local_1280,&local_1288);
                uVar11 = uVar12;
              } while (iVar4 != 0);
              uVar13 = 0;
              uVar10 = 0;
              if ((uint)uVar12 != 0) {
                fprintf(_stderr,"%s: WARNING %d of %d file(s) cannot be processed\n",*argv,
                        uVar12 & 0xffffffff,(ulong)uVar8);
                uVar10 = (uint)uVar12;
              }
              if (local_1284 != 0) {
                fprintf(_stderr,
                        "%s: WARNING %d of %d processed file(s) failed GOST hash sum check\n",*argv,
                        (ulong)local_1284,(ulong)(uVar8 - uVar10));
                uVar13 = 1;
              }
            }
            uVar10 = uVar10 | uVar13;
            goto LAB_0010175d;
          }
          pcVar6 = argv[_optind];
          goto LAB_0010178d;
        }
        bVar1 = true;
        iVar4 = hashsize;
      }
    }
    if (iVar3 != 99) {
      if (iVar3 != -1) {
        if (iVar3 != 0x68) goto LAB_00101410;
        help();
      }
      iVar4 = _optind;
      if (f != (FILE *)0x0) goto LAB_00101436;
      if (bVar1) {
        iVar4 = feof(_stdin);
        uVar10 = 0;
        if (iVar4 != 0) goto LAB_0010175d;
        uVar10 = 0;
        goto LAB_00101670;
      }
      if (argc == _optind) {
        iVar4 = fileno(_stdin);
        iVar4 = hash_stream(&local_1148,iVar4,local_1038,hashsize);
        if (iVar4 != 0) {
          printf("%s -\n",local_1038);
          exit(0);
        }
        perror("stdin");
        exit(1);
      }
      uVar10 = 0;
      if (_optind < argc) {
        iVar3 = argc - _optind;
        lVar9 = 0;
        uVar10 = 0;
        do {
          iVar5 = hash_file(&local_1148,argv[iVar4 + lVar9],local_1038,0,hashsize);
          if (iVar5 == 0) {
            uVar10 = uVar10 + 1;
          }
          else {
            printf("%s %s\n",local_1038,argv[iVar4 + lVar9]);
          }
          lVar9 = lVar9 + 1;
        } while (iVar3 != (int)lVar9);
      }
      goto LAB_0010175d;
    }
    iVar4 = hashsize;
    f = _stdin;
  } while ((_optarg == (char *)0x0) || (f = fopen(_optarg,"r"), pcVar6 = _optarg, f != (FILE *)0x0))
  ;
LAB_0010178d:
  perror(pcVar6);
  exit(2);
  while( true ) {
    pcVar6 = &local_1148.field_0x10f;
    do {
      pcVar7 = pcVar6;
      pcVar6 = pcVar7 + 1;
    } while (pcVar7[1] != '\0');
    for (; (*pcVar7 == '\r' || (*pcVar7 == '\n')); pcVar7 = pcVar7 + -1) {
      *pcVar7 = '\0';
    }
    iVar4 = hash_file(&local_1148,local_1038,local_1268,0,hashsize);
    if (iVar4 == 0) {
      uVar10 = uVar10 + 1;
    }
    else {
      printf("%s %s\n",local_1268,local_1038);
    }
    iVar4 = feof(_stdin);
    if (iVar4 != 0) break;
LAB_00101670:
    pcVar6 = fgets(local_1038,0x1000,_stdin);
    if (pcVar6 == (char *)0x0) break;
  }
LAB_0010175d:
  exit((uint)(uVar10 != 0));
}

Assistant:

int main(int argc, char **argv)
{
    int c, i;
    int verbose = 0;
    int errors = 0;
    int open_mode = O_RDONLY | O_BINARY;
    FILE *check_file = NULL;
    int filenames_from_stdin = 0;
    int hashsize = 32;
    gost_hash_ctx ctx;

    while ((c = getopt(argc, argv, "hxlvc::")) != -1) {
        switch (c) {
        case 'h':
            help();
            exit(0);
            break;
        case 'v':
            verbose = 1;
            break;
        case 'l':
            hashsize = 64;
            break;
        case 'x':
            filenames_from_stdin = 1;
            break;
        case 'c':
            if (optarg) {
                check_file = fopen(optarg, "r");
                if (!check_file) {
                    perror(optarg);
                    exit(2);
                }
            } else {
                check_file = stdin;
            }
            break;
        default:
            fprintf(stderr, "invalid option %c\n", optopt);
            help();
        }
    }

    if (check_file) {
        char inhash[MAX_HASH_TXT_BYTES + 1], calcsum[MAX_HASH_TXT_BYTES + 1],
            filename[PATH_MAX];
        int failcount = 0, count = 0;
        int expected_hash_size = 0;
        if (check_file == stdin && optind < argc) {
            check_file = fopen(argv[optind], "r");
            if (!check_file) {
                perror(argv[optind]);
                exit(2);
            }
        }
        while (get_line
               (check_file, inhash, filename, verbose, &expected_hash_size)) {
            int error = 0;
            if (expected_hash_size == 0) {
                fprintf(stderr, "%s: invalid hash length\n", filename);
                errors++;
                count++;
                continue;
            }

            if (!hash_file
                (&ctx, filename, calcsum, open_mode, expected_hash_size)) {
                errors++;
                error = 1;
            }
            count++;
            if (error)
                continue;

            if (!strncmp(calcsum, inhash, expected_hash_size * 2 + 1)) {
                if (verbose) {
                    fprintf(stderr, "%s\tOK\n", filename);
                }
            } else {
                if (verbose) {
                    fprintf(stderr, "%s\tFAILED\n", filename);
                } else {
                    fprintf(stderr, "%s: GOST hash sum check failed\n",
                            filename);
                }
                failcount++;
            }
        }
        if (errors) {
            fprintf(stderr,
                    "%s: WARNING %d of %d file(s) cannot be processed\n",
                    argv[0], errors, count);

        }
        if (failcount) {
            fprintf(stderr,
                    "%s: WARNING %d of %d processed file(s) failed GOST hash sum check\n",
                    argv[0], failcount, count - errors);
        }
        exit((failcount || errors) ? 1 : 0);
    } else if (filenames_from_stdin) {
        char sum[MAX_HASH_TXT_BYTES + 1];
        char filename[PATH_MAX + 1], *end;
        while (!feof(stdin)) {
            if (!fgets(filename, PATH_MAX, stdin))
                break;
            for (end = filename; *end; end++) ;
            end--;
            for (; *end == '\n' || *end == '\r'; end--)
                *end = 0;
            if (!hash_file(&ctx, filename, sum, open_mode, hashsize)) {
                errors++;
            } else {
                printf("%s %s\n", sum, filename);
            }
        }

    } else if (optind == argc) {
        char sum[MAX_HASH_TXT_BYTES + 1];
        if (!hash_stream(&ctx, fileno(stdin), sum, hashsize)) {
            perror("stdin");
            exit(1);
        }
        printf("%s -\n", sum);
        exit(0);
    } else {
        for (i = optind; i < argc; i++) {
            char sum[MAX_HASH_TXT_BYTES + 1];
            if (!hash_file(&ctx, argv[i], sum, open_mode, hashsize)) {
                errors++;
            } else {
                printf("%s %s\n", sum, argv[i]);
            }
        }
    }
    exit(errors ? 1 : 0);
}